

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satMem.c
# Opt level: O1

void Sat_MmStepEntryRecycle(Sat_MmStep_t *p,char *pEntry,int nBytes)

{
  Sat_MmFixed_t *pSVar1;
  
  if ((nBytes != 0) && (nBytes <= p->nMapSize)) {
    pSVar1 = p->pMap[nBytes];
    pSVar1->nEntriesUsed = pSVar1->nEntriesUsed + -1;
    *(char **)pEntry = pSVar1->pEntriesFree;
    pSVar1->pEntriesFree = pEntry;
  }
  return;
}

Assistant:

void Sat_MmStepEntryRecycle( Sat_MmStep_t * p, char * pEntry, int nBytes )
{
    if ( nBytes == 0 )
        return;
    if ( nBytes > p->nMapSize )
    {
//        ABC_FREE( pEntry );
        return;
    }
    Sat_MmFixedEntryRecycle( p->pMap[nBytes], pEntry );
}